

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O0

void __thiscall choc::html::HTMLElement::~HTMLElement(HTMLElement *this)

{
  HTMLElement *this_local;
  
  std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>::~vector
            (&this->children);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->properties);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

explicit HTMLElement (std::string elementName) : name (std::move (elementName)) {}